

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O1

int Bmc_BmciPerform(Gia_Man_t *p,Vec_Int_t *vInit0,Vec_Int_t *vInit1,int nFrames,int nWords,
                   int nTimeOut,int fVerbose)

{
  char *__s;
  int *piVar1;
  int *piVar2;
  Gia_Man_t *pGVar3;
  sat_solver *psVar4;
  int iVar5;
  uint uVar6;
  uint extraout_EAX;
  uint uVar7;
  uint extraout_EAX_00;
  Gia_Man_t *pGVar8;
  size_t sVar9;
  char *__dest;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Vec_Int_t *pVVar14;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  long lVar15;
  Gia_Obj_t *pGVar16;
  int iVar17;
  long lVar18;
  abctime aVar19;
  uint uVar20;
  Vec_Int_t *pVVar21;
  ulong uVar22;
  ulong uVar23;
  int iLit;
  Gia_Man_t *pNew;
  timespec ts;
  uint local_dc;
  Vec_Int_t *local_d8;
  Vec_Int_t *local_d0;
  Gia_Man_t *local_c8;
  sat_solver *local_c0;
  timespec local_b8;
  Vec_Int_t *local_a8;
  int local_a0;
  uint local_9c;
  Gia_Man_t *local_98;
  ulong local_90;
  Vec_Int_t *local_88;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  long local_68;
  uint local_5c;
  Vec_Int_t *local_58;
  Gia_Man_t *local_50;
  Vec_Int_t *local_48;
  ulong local_40;
  long local_38;
  
  local_7c = nFrames;
  if (vInit0->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vInit0) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xba,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  if (vInit1->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vInit1) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xbb,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  local_c0 = sat_solver_new();
  if (nTimeOut == 0) {
    aVar19 = 0;
  }
  else {
    iVar5 = clock_gettime(3,&local_b8);
    if (iVar5 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_b8.tv_nsec / 1000 +
               CONCAT44(local_b8.tv_sec._4_4_,(uint)local_b8.tv_sec) * 1000000;
    }
    aVar19 = lVar18 + (long)nTimeOut * 1000000;
  }
  local_c0->nRuntimeLimit = aVar19;
  local_5c = nTimeOut;
  pGVar8 = Gia_ManStart(10000);
  __s = p->pName;
  piVar11 = (int *)0x0;
  local_c8 = pGVar8;
  local_98 = p;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(__s);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s);
  }
  pGVar8->pName = __dest;
  Gia_ManHashAlloc(local_c8);
  local_98->pObjs->Value = 0;
  iVar5 = local_98->nRegs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar17 = iVar5;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar17;
  if (iVar17 != 0) {
    piVar11 = (int *)malloc((long)iVar17 << 2);
  }
  pVVar10->pArray = piVar11;
  local_88 = pVVar10;
  if (0 < vInit0->nSize) {
    lVar18 = 0;
    do {
      pGVar8 = local_c8;
      uVar20 = vInit0->pArray[lVar18];
      local_dc = uVar20;
      if (1 < (int)uVar20) {
        pGVar12 = Gia_ManAppendObj(local_c8);
        uVar22 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar22 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar22 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar8->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar16 = pGVar8->pObjs;
        if ((pGVar12 < pGVar16) || (pGVar16 + pGVar8->nObjs <= pGVar12)) goto LAB_0053f2e1;
        Vec_IntPush(pGVar8->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * -0x55555555);
        pGVar16 = pGVar8->pObjs;
        if ((pGVar12 < pGVar16) || (pGVar16 + pGVar8->nObjs <= pGVar12)) goto LAB_0053f2e1;
        uVar20 = (int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * 0x55555556;
        pVVar10 = local_88;
      }
      Vec_IntPush(pVVar10,uVar20);
      lVar18 = lVar18 + 1;
    } while (lVar18 < vInit0->nSize);
  }
  pGVar8 = local_98;
  iVar5 = local_98->nRegs;
  local_a8 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar17 = iVar5;
  }
  local_a8->nSize = 0;
  local_a8->nCap = iVar17;
  if (iVar17 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar17 << 2);
  }
  local_a8->pArray = piVar11;
  if (0 < vInit1->nSize) {
    lVar18 = 0;
    do {
      pGVar3 = local_c8;
      uVar20 = vInit1->pArray[lVar18];
      local_dc = uVar20;
      if (1 < (int)uVar20) {
        pGVar12 = Gia_ManAppendObj(local_c8);
        uVar22 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar22 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar22 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar3->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar16 = pGVar3->pObjs;
        if ((pGVar12 < pGVar16) || (pGVar16 + pGVar3->nObjs <= pGVar12)) {
LAB_0053f2e1:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pGVar3->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * -0x55555555);
        pGVar16 = pGVar3->pObjs;
        if ((pGVar12 < pGVar16) || (pGVar16 + pGVar3->nObjs <= pGVar12)) goto LAB_0053f2e1;
        uVar20 = (int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * 0x55555556;
      }
      Vec_IntPush(local_a8,uVar20);
      lVar18 = lVar18 + 1;
    } while (lVar18 < vInit1->nSize);
  }
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar10->pArray = piVar11;
  local_d0 = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar10->pArray = piVar11;
  local_d8 = pVVar10;
  pVVar13 = (Vec_Int_t *)malloc(0x10);
  pVVar13->nCap = 1000;
  pVVar13->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar13->pArray = piVar11;
  pVVar14 = (Vec_Int_t *)malloc(0x10);
  pVVar14->nCap = 1000;
  pVVar14->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar14->pArray = piVar11;
  pVVar10 = local_d0;
  pVVar21 = local_88;
  local_58 = pVVar14;
  if ((int)local_7c < 1) {
    local_a0 = 1;
  }
  else {
    local_a0 = 1;
    local_70 = 1;
    local_90 = 0;
    local_48 = pVVar13;
    do {
      pVVar13 = local_a8;
      iVar5 = clock_gettime(3,&local_b8);
      if (iVar5 < 0) {
        lVar18 = 1;
      }
      else {
        lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8.tv_nsec),8);
        lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
                 CONCAT44(local_b8.tv_sec._4_4_,(uint)local_b8.tv_sec) * -1000000;
      }
      Bmc_BmciUnfold(local_c8,pGVar8,pVVar21,0);
      Bmc_BmciUnfold(local_c8,pGVar8,pVVar13,1);
      uVar20 = pVVar21->nSize;
      uVar7 = pVVar13->nSize;
      local_68 = (long)(int)uVar7;
      if (uVar20 != uVar7) {
        __assert_fail("Vec_IntSize(vLits0) == Vec_IntSize(vLits1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0xd7,
                      "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                     );
      }
      pVVar10->nSize = 0;
      local_38 = lVar18;
      if ((int)uVar20 < 1) {
        local_9c = 0;
      }
      else {
        piVar11 = pVVar21->pArray;
        uVar22 = 0;
        uVar23 = 0;
        if (0 < (int)uVar7) {
          uVar23 = (ulong)uVar7;
        }
        local_9c = 0;
        do {
          if (uVar23 == uVar22) goto LAB_0053f2c2;
          iVar5 = piVar11[uVar22];
          iVar17 = pVVar13->pArray[uVar22];
          if ((iVar5 < 2 && iVar17 < 2) || (iVar5 == iVar17)) {
            Vec_IntPush(local_d0,-1);
          }
          else {
            iVar5 = Gia_ManHashXor(local_c8,iVar5,iVar17);
            Vec_IntPush(local_d0,iVar5);
            local_9c = local_9c + 1;
          }
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      pVVar13 = local_48;
      pGVar8 = local_98;
      pVVar10 = local_d0;
      uVar7 = local_d0->nSize;
      if (uVar7 != local_98->nRegs) {
        __assert_fail("Vec_IntSize(vMiters) == Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0xdf,
                      "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                     );
      }
      if ((int)uVar7 < 1) {
        uVar6 = 0;
      }
      else {
        uVar22 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + local_d0->pArray[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar7 != uVar22);
      }
      if ((int)local_68 + uVar6 == 0) {
        iVar5 = 8;
        if (fVerbose != 0) {
          uVar6 = printf("Reached a fixed point after %d frames.  \n",(ulong)((int)local_90 + 1));
        }
      }
      else {
        local_78 = (ulong)uVar7;
        local_40 = (ulong)uVar20;
        pGVar8 = Bmc_BmciPart(local_c8,local_d8,local_d0,local_48,local_58);
        pAig = Gia_ManToAigSimple(pGVar8);
        pAig->nRegs = 0;
        p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
        Aig_ManStop(pAig);
        psVar4 = local_c0;
        uVar22 = (ulong)(uint)pGVar8->nObjs;
        iVar5 = (int)local_70;
        if ((0 < pGVar8->nObjs) && (pGVar8->pObjs != (Gia_Obj_t *)0x0)) {
          lVar18 = 0;
          do {
            if ((int)uVar22 <= lVar18) goto LAB_0053f2e1;
            iVar17 = p_00->pVarNums[lVar18];
            if (-1 < iVar17) {
              p_00->pVarNums[lVar18] = iVar17 + iVar5;
            }
            lVar18 = lVar18 + 1;
            uVar22 = (ulong)pGVar8->nObjs;
          } while (lVar18 < (long)uVar22);
        }
        if (0 < p_00->nLiterals) {
          piVar11 = *p_00->pClauses;
          lVar18 = 0;
          do {
            piVar11[lVar18] = piVar11[lVar18] + iVar5 * 2;
            lVar18 = lVar18 + 1;
          } while (lVar18 < p_00->nLiterals);
        }
        uVar20 = iVar5 + p_00->nVars;
        local_50 = pGVar8;
        sat_solver_setnvars(local_c0,uVar20);
        lVar18 = 0;
        while (lVar18 < p_00->nClauses) {
          iVar5 = sat_solver_addclause(psVar4,p_00->pClauses[lVar18],p_00->pClauses[lVar18 + 1]);
          lVar18 = lVar18 + 1;
          if (iVar5 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                          ,0xee,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
        }
        pVVar10 = local_50->vCis;
        uVar22 = (ulong)(uint)pVVar10->nSize;
        pGVar8 = local_50;
        local_70 = (ulong)uVar20;
        if (local_50->nRegs < pVVar10->nSize) {
          lVar18 = 0;
          pVVar21 = local_d8;
          do {
            psVar4 = local_c0;
            if ((int)uVar22 <= lVar18) goto LAB_0053f2c2;
            iVar5 = pVVar10->pArray[lVar18];
            lVar15 = (long)iVar5;
            if ((lVar15 < 0) || (pGVar8->nObjs <= iVar5)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (pGVar8->pObjs == (Gia_Obj_t *)0x0) break;
            if (pVVar13->nSize <= iVar5) goto LAB_0053f2c2;
            iVar5 = pVVar13->pArray[lVar15];
            if (((long)iVar5 < 0) || (pVVar21->nSize <= iVar5)) goto LAB_0053f2c2;
            uVar20 = pVVar21->pArray[iVar5];
            if (uVar20 != 0xffffffff) {
              if ((int)(uVar20 | p_00->pVarNums[lVar15]) < 0) {
                __assert_fail("iVarA >= 0 && iVarB >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                              ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
              }
              uVar7 = p_00->pVarNums[lVar15] * 2;
              local_b8.tv_sec._4_4_ = uVar20 * 2 + 1;
              local_b8.tv_sec._0_4_ = uVar7;
              iVar5 = sat_solver_addclause(local_c0,(lit *)&local_b8,(lit *)&local_b8.tv_nsec);
              pVVar21 = local_d8;
              pGVar8 = local_50;
              pVVar13 = local_48;
              if (iVar5 != 0) {
                local_b8.tv_sec._4_4_ = uVar20 * 2;
                local_b8.tv_sec._0_4_ = uVar7 | 1;
                sat_solver_addclause(psVar4,(lit *)&local_b8,(lit *)&local_b8.tv_nsec);
                pVVar21 = local_d8;
                pGVar8 = local_50;
                pVVar13 = local_48;
              }
            }
            lVar18 = lVar18 + 1;
            pVVar10 = pGVar8->vCis;
            uVar22 = (ulong)pVVar10->nSize;
          } while (lVar18 < (long)(uVar22 - (long)pGVar8->nRegs));
        }
        pVVar21 = local_88;
        if ((0 < pGVar8->nObjs) && (pGVar16 = pGVar8->pObjs, pGVar16 != (Gia_Obj_t *)0x0)) {
          lVar18 = 0;
          do {
            uVar20 = (uint)*(undefined8 *)pGVar16;
            if ((((uVar20 & 0x9fffffff) == 0x9fffffff) ||
                (-1 < (int)uVar20 && (~uVar20 & 0x1fffffff) != 0)) && (-1 < p_00->pVarNums[lVar18]))
            {
              if ((uVar20 & 0x9fffffff) != 0x9fffffff) {
                if (pVVar13->nSize <= lVar18) goto LAB_0053f2c2;
                iVar5 = pVVar13->pArray[lVar18];
                if (((long)iVar5 < 0) || (local_d8->nSize <= iVar5)) goto LAB_0053f2c2;
                if (local_d8->pArray[iVar5] != -1) {
                  __assert_fail("Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                                ,0xfc,
                                "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                               );
                }
              }
              if (pVVar13->nSize <= lVar18) goto LAB_0053f2c2;
              iVar5 = pVVar13->pArray[lVar18];
              if (((long)iVar5 < 0) || (local_d8->nSize <= iVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              local_d8->pArray[iVar5] = p_00->pVarNums[lVar18];
            }
            lVar18 = lVar18 + 1;
            pGVar16 = pGVar16 + 1;
          } while (lVar18 < pGVar8->nObjs);
        }
        Cnf_DataFree(p_00);
        Gia_ManStop(pGVar8);
        if ((int)local_78 < 1) {
          uVar20 = 0;
          uVar6 = extraout_EAX;
        }
        else {
          piVar11 = local_d0->pArray;
          lVar18 = (long)(int)local_40;
          uVar23 = 0;
          uVar20 = 0;
          uVar22 = local_78;
          pVVar10 = local_d8;
          do {
            uVar6 = piVar11[uVar23];
            local_dc = uVar6;
            if (uVar6 != 0xffffffff) {
              if ((int)uVar6 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if (pVVar10->nSize <= (int)(uVar6 >> 1)) goto LAB_0053f2c2;
              if (pVVar10->pArray[uVar6 >> 1] < 1) {
                __assert_fail("Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                              ,0x107,
                              "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                             );
              }
              local_dc = (uVar6 & 1) + pVVar10->pArray[uVar6 >> 1] * 2;
              iVar5 = sat_solver_solve(local_c0,(lit *)&local_dc,(lit *)&local_d8,0,0,0,0);
              uVar22 = local_78;
              pVVar10 = local_d8;
              if (iVar5 == -1) {
                if ((lVar18 <= (long)uVar23) || (local_68 <= (long)uVar23)) {
LAB_0053f2c2:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                piVar1 = pVVar21->pArray;
                iVar5 = piVar1[uVar23];
                piVar2 = local_a8->pArray;
                iVar17 = piVar2[uVar23];
                if ((iVar5 < 2 && iVar17 < 2) || (iVar5 == iVar17)) {
                  __assert_fail("(iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                                ,0x118,
                                "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                               );
                }
                if (iVar17 < 2) {
                  piVar1[uVar23] = iVar17;
                }
                else {
                  piVar2[uVar23] = iVar5;
                }
                uVar6 = piVar1[uVar23];
                if (uVar6 != piVar2[uVar23]) {
                  __assert_fail("iLit0 == iLit1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                                ,0x11f,
                                "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                               );
                }
              }
              else {
                if (iVar5 != 1) {
                  if (iVar5 != 0) {
                    __assert_fail("status == l_False",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                                  ,0x115,
                                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                                 );
                  }
                  local_a0 = 0;
                  uVar6 = printf("Timeout reached after %d seconds.  \n",(ulong)local_5c);
                  iVar5 = 0x1a;
                  pGVar8 = local_98;
                  pVVar10 = local_d0;
                  goto LAB_0053f16e;
                }
                uVar20 = uVar20 + 1;
                uVar6 = 1;
              }
            }
            uVar23 = uVar23 + 1;
          } while (uVar22 != uVar23);
        }
        pGVar8 = local_98;
        if (fVerbose != 0) {
          printf("Frame %4d : ",(ulong)((int)local_90 + 1));
          printf("Vars =%7d  ",local_70);
          psVar4 = local_c0;
          uVar7 = sat_solver_nclauses(local_c0);
          printf("Clause =%10d  ",(ulong)uVar7);
          uVar7 = sat_solver_nconflicts(psVar4);
          printf("Conflict =%10d  ",(ulong)uVar7);
          printf("AIG =%7d  ",
                 (ulong)(uint)(~(local_c8->vCos->nSize + local_c8->vCis->nSize) + local_c8->nObjs));
          printf("Miters =%5d  ",(ulong)local_9c);
          printf("SAT =%5d  ",(ulong)uVar20);
          iVar17 = 3;
          iVar5 = clock_gettime(3,&local_b8);
          if (iVar5 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = local_b8.tv_nsec / 1000 +
                     CONCAT44(local_b8.tv_sec._4_4_,(uint)local_b8.tv_sec) * 1000000;
          }
          lVar18 = lVar18 + local_38;
          Abc_Print(iVar17,"%s =","Time");
          Abc_Print(iVar17,"%9.2f sec\n",(double)lVar18 / 1000000.0);
          uVar6 = extraout_EAX_00;
        }
        iVar5 = 0;
        pVVar10 = local_d0;
        if (uVar20 == 0) {
          uVar6 = printf("Reached a fixed point after %d frames.  \n",(ulong)((int)local_90 + 1));
          iVar5 = 8;
          pVVar10 = local_d0;
        }
      }
LAB_0053f16e:
      if (iVar5 != 0) {
        if ((iVar5 != 8) && (iVar5 != 0x1a)) {
          return uVar6;
        }
        break;
      }
      uVar20 = (int)local_90 + 1;
      local_90 = (ulong)uVar20;
    } while (uVar20 != local_7c);
  }
  pVVar14 = local_a8;
  sat_solver_delete(local_c0);
  Gia_ManStopP(&local_c8);
  if (pVVar21->pArray != (int *)0x0) {
    free(pVVar21->pArray);
    pVVar21->pArray = (int *)0x0;
  }
  free(pVVar21);
  if (pVVar14->pArray != (int *)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (int *)0x0;
  }
  free(pVVar14);
  pVVar21 = local_58;
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  pVVar10 = local_d8;
  if (local_d8->pArray != (int *)0x0) {
    free(local_d8->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  if (pVVar13->pArray != (int *)0x0) {
    free(pVVar13->pArray);
    pVVar13->pArray = (int *)0x0;
  }
  free(pVVar13);
  if (pVVar21->pArray != (int *)0x0) {
    free(pVVar21->pArray);
    pVVar21->pArray = (int *)0x0;
  }
  free(pVVar21);
  return local_a0;
}

Assistant:

int Bmc_BmciPerform( Gia_Man_t * p, Vec_Int_t * vInit0, Vec_Int_t * vInit1, int nFrames, int nWords, int nTimeOut, int fVerbose )
{
    int nSatVars = 1;
    Vec_Int_t * vLits0, * vLits1, * vMiters, * vSatMap, * vPartMap, * vCopies;
    Gia_Man_t * pNew, * pPart;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int iVar0, iVar1, iLit, iLit0, iLit1;
    int i, f, status, nChanges, nMiters, RetValue = 1;
    assert( Vec_IntSize(vInit0) == Gia_ManRegNum(p) );
    assert( Vec_IntSize(vInit1) == Gia_ManRegNum(p) );

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;

    vLits0 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit0, iLit, i )
        Vec_IntPush( vLits0, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vLits1 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit1, iLit, i )
        Vec_IntPush( vLits1, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vMiters  = Vec_IntAlloc( 1000 );
    vSatMap  = Vec_IntAlloc( 1000 );
    vPartMap = Vec_IntAlloc( 1000 );
    vCopies  = Vec_IntAlloc( 1000 );
    for ( f = 0; f < nFrames; f++ )
    {
        abctime clk = Abc_Clock();
        Bmc_BmciUnfold( pNew, p, vLits0, 0 );
        Bmc_BmciUnfold( pNew, p, vLits1, 1 );
        assert( Vec_IntSize(vLits0) == Vec_IntSize(vLits1) );
        nMiters  = 0;
        Vec_IntClear( vMiters );
        Vec_IntForEachEntryTwo( vLits0, vLits1, iLit0, iLit1, i )
            if ( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 )
                Vec_IntPush( vMiters, Gia_ManHashXor(pNew, iLit0, iLit1) ), nMiters++;
            else
                Vec_IntPush( vMiters, -1 );
        assert( Vec_IntSize(vMiters) == Gia_ManRegNum(p) );
        if ( Vec_IntSum(vMiters) + Vec_IntSize(vLits1) == 0 )
        {
            if ( fVerbose )
                printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
        // create new part
        pPart = Bmc_BmciPart( pNew, vSatMap, vMiters, vPartMap, vCopies );
        pCnf = Cnf_DeriveGiaRemapped( pPart );
        Cnf_DataLiftGia( pCnf, pPart, nSatVars );
        nSatVars += pCnf->nVars;
        sat_solver_setnvars( pSat, nSatVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
        // stitch the clauses
        Gia_ManForEachPi( pPart, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pPart, pObj)];
            iVar1 = Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, Gia_ObjId(pPart, pObj)) );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // transfer variables
        Gia_ManForEachCand( pPart, pObj, i )
            if ( pCnf->pVarNums[i] >= 0 )
            {
                assert( Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1 );
                Vec_IntWriteEntry( vSatMap, Vec_IntEntry(vPartMap, i), pCnf->pVarNums[i] );
            }
        Cnf_DataFree( pCnf );
        Gia_ManStop( pPart );
        // perform runs
        nChanges = 0;
        Vec_IntForEachEntry( vMiters, iLit, i )
        {
            if ( iLit == -1 )
                continue;
            assert( Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0 );
            iLit = Abc_Lit2LitV( Vec_IntArray(vSatMap), iLit );
            status = sat_solver_solve( pSat, &iLit, &iLit + 1, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( status == l_True )
            {
                nChanges++;
                continue;
            }
            if ( status == l_Undef )
            {
                printf( "Timeout reached after %d seconds.  \n", nTimeOut );
                RetValue = 0;
                goto cleanup;
            }
            assert( status == l_False );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 );
            if ( iLit1 >= 2 )
                Vec_IntWriteEntry( vLits1, i, iLit0 );
            else
                Vec_IntWriteEntry( vLits0, i, iLit1 );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( iLit0 == iLit1 );
        }
        if ( fVerbose )
        {
            printf( "Frame %4d : ",     f+1 );
            printf( "Vars =%7d  ",      nSatVars );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "AIG =%7d  ",       Gia_ManAndNum(pNew) );
            printf( "Miters =%5d  ",    nMiters );
            printf( "SAT =%5d  ",       nChanges );
            Abc_PrintTime( 1, "Time",   Abc_Clock() - clk );
        }
        if ( nChanges == 0 )
        {
            printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
    }
cleanup:

    sat_solver_delete( pSat );
    Gia_ManStopP( &pNew );
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vMiters );
    Vec_IntFree( vSatMap );
    Vec_IntFree( vPartMap );
    Vec_IntFree( vCopies );
    return RetValue;
}